

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::PointCoordCase::iterate(PointCoordCase *this)

{
  TestLog *log;
  RenderContext *pRVar1;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  ulong extraout_RAX;
  ulong uVar11;
  TestError *pTVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char *description;
  pointer pVVar16;
  int iVar17;
  int xo;
  int iVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar28;
  undefined1 auVar27 [16];
  float fVar29;
  float fVar30;
  allocator<char> local_322;
  allocator<char> local_321;
  float pointSizeRange [2];
  RGBA local_304;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> coords;
  uint local_2e8;
  uint uStack_2e0;
  uint uStack_2dc;
  Surface refImg;
  undefined1 local_2a8 [48];
  undefined8 local_278;
  uint uStack_270;
  uint uStack_26c;
  pointer local_260;
  ulong local_258;
  Random rnd;
  Surface testImg;
  string local_228;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  VertexArrayBinding posBinding;
  ShaderProgram program;
  long lVar9;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar2 = pRVar10->m_width;
  lVar3._0_4_ = (pRVar10->m_pixelFormat).redBits;
  lVar3._4_4_ = (pRVar10->m_pixelFormat).greenBits;
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar8 = pRVar10->m_height;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&coords,8,(allocator_type *)&program);
  pointSizeRange[0] = 0.0;
  pointSizeRange[1] = 0.0;
  deRandom_init(&rnd.m_rnd,0x145fa);
  uVar28 = -(uint)((int)uVar8 < 0x100);
  uStack_270 = (undefined4)lVar3 & -(uint)((int)(undefined4)lVar3 < 0);
  uStack_26c = lVar3._4_4_ & -(uint)(lVar3 < 0);
  uVar13 = ~-(uint)((int)uVar2 < 0x100) & 0x100 | uVar2 & -(uint)((int)uVar2 < 0x100);
  uVar8 = ~uVar28 & 0x100 | uVar8 & uVar28;
  local_278 = CONCAT44(uVar8,uVar13);
  tcu::Surface::Surface(&testImg,uVar13,uVar8);
  tcu::Surface::Surface(&refImg,uVar13,uVar8);
  (**(code **)(lVar9 + 0x818))(0x846d,pointSizeRange);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x1db);
  if (((pointSizeRange[0] <= 0.0) || (pointSizeRange[1] <= 0.0)) ||
     (pointSizeRange[1] < pointSizeRange[0])) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"Invalid GL_ALIASED_POINT_SIZE_RANGE",
               (allocator<char> *)&posBinding);
    tcu::TestError::TestError(pTVar12,(string *)&program);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  for (pVVar16 = coords.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pVVar16 !=
      coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pVVar16 = pVVar16 + 1) {
    fVar21 = deRandom_getFloat(&rnd.m_rnd);
    pVVar16->m_data[0] = fVar21 * 1.8 + -0.9;
    fVar21 = deRandom_getFloat(&rnd.m_rnd);
    pVVar16->m_data[1] = fVar21 * 1.8 + -0.9;
    fVar21 = pointSizeRange[0];
    fVar25 = pointSizeRange[1];
    fVar22 = deRandom_getFloat(&rnd.m_rnd);
    pVVar16->m_data[2] = (fVar25 - fVar21) * fVar22 + fVar21;
  }
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,
             "attribute highp vec3 a_positionSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n\tgl_PointSize = a_positionSize.z;\n}\n"
             ,&local_321);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "void main (void)\n{\n\tgl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n}\n",&local_322)
  ;
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)local_2a8,&local_228);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)local_2a8);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&posBinding,"Compile failed",(allocator<char> *)local_2a8);
    tcu::TestError::TestError(pTVar12,(string *)&posBinding);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,"a_positionSize",(allocator<char> *)&local_228);
  glu::va::Float(&posBinding,(string *)local_2a8,3,
                 (int)(((long)coords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)coords.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc),0,
                 (coords.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::__cxx11::string::~string((string *)local_2a8);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = de::Random::getInt(&rnd,0,pRVar10->m_width - uVar13);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = de::Random::getInt(&rnd,0,pRVar10->m_height - uVar8);
  (**(code **)(lVar9 + 0x1a00))(iVar5,iVar7,uVar13,uVar8);
  (**(code **)(lVar9 + 0x1c0))();
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
  local_2a8._4_4_ =
       (ChannelType)
       (((long)coords.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)coords.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0xc);
  local_2a8._0_4_ = RA;
  local_2a8._8_4_ = 3;
  local_2a8._16_8_ = 0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
            &posBinding,(PrimitiveList *)local_2a8,(DrawUtilCallback *)0x0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_2a8,&testImg);
  glu::readPixels(pRVar1,iVar5,iVar7,(PixelBufferAccess *)local_2a8);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x20d);
  std::__cxx11::string::~string((string *)&posBinding.binding.name);
  tcu::Surface::getAccess((PixelBufferAccess *)&posBinding,&refImg);
  local_2a8._0_4_ = R;
  local_2a8._4_4_ = SNORM_INT8;
  local_2a8._8_8_ = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&posBinding,(Vec4 *)local_2a8);
  fStack_1e4 = (float)(int)local_278;
  local_1e8 = (float)local_278._4_4_;
  local_1f8 = 0.5;
  fStack_1f4 = 0.5;
  fStack_1f0 = 0.5;
  fStack_1ec = 0.5;
  local_208 = 0.5;
  fStack_204 = 0.5;
  fStack_200 = -0.5;
  fStack_1fc = -0.5;
  uVar11 = extraout_RAX;
  fStack_1e0 = local_1e8;
  fStack_1dc = fStack_1e4;
  while (fVar21 = -0.5,
        coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
    fVar26 = (float)*(undefined8 *)
                     (coords.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data;
    fVar24 = (float)((ulong)*(undefined8 *)
                             (coords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data >> 0x20);
    fVar25 = (coords.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data[2];
    fVar22 = fVar25 * local_208 + (fVar24 * local_1f8 + local_1f8) * local_1e8;
    fVar23 = fVar25 * fStack_204 + (fVar26 * fStack_1f4 + fStack_1f4) * fStack_1e4;
    fVar24 = fVar25 * fStack_200 + (fVar24 * fStack_1f0 + fStack_1f0) * fStack_1e0;
    fVar25 = fVar25 * fStack_1fc + (fVar26 * fStack_1ec + fStack_1ec) * fStack_1dc;
    auVar27._4_4_ = -(uint)(fVar23 < 0.0);
    auVar27._0_4_ = -(uint)(fVar22 < 0.0);
    auVar27._8_4_ = -(uint)(fVar24 < 0.0);
    auVar27._12_4_ = -(uint)(fVar25 < 0.0);
    uVar8 = movmskps((int)uVar11,auVar27);
    fVar26 = -0.5;
    if ((uVar8 & 8) == 0) {
      fVar26 = 0.5;
    }
    fVar29 = -0.5;
    if ((uVar8 & 4) == 0) {
      fVar29 = 0.5;
    }
    fVar30 = -0.5;
    if ((uVar8 & 2) == 0) {
      fVar30 = 0.5;
    }
    if ((uVar8 & 1) == 0) {
      fVar21 = 0.5;
    }
    iVar19 = (int)(fVar25 + fVar26);
    uVar13 = (uint)(fVar24 + fVar29);
    local_258 = (ulong)uVar13;
    iVar7 = (int)(fVar23 + fVar30) - iVar19;
    uVar8 = (int)(fVar21 + fVar22) - uVar13;
    uVar11 = (ulong)uVar8;
    uVar15 = 0;
    iVar5 = iVar7;
    if (iVar7 < 1) {
      iVar5 = 0;
    }
    local_260 = coords.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    uVar28 = 0;
    if (0 < (int)uVar8) {
      uVar28 = uVar8;
    }
    while (uVar14 = (uint)uVar15, uVar14 != uVar28) {
      fVar21 = ((float)(int)(~uVar14 + uVar8) + 0.5) / (float)(int)uVar8;
      iVar20 = uVar14 + (int)local_258;
      uVar11 = local_258;
      local_278 = uVar15;
      for (iVar18 = 0; iVar5 != iVar18; iVar18 = iVar18 + 1) {
        posBinding.binding.type = (Type)(((float)iVar18 + 0.5) / (float)iVar7);
        posBinding.binding.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
        iVar17 = iVar19 + iVar18;
        posBinding.binding._4_4_ = fVar21;
        if (((-1 < iVar17) && (iVar17 < refImg.m_width)) &&
           ((-1 < iVar20 && (iVar20 < refImg.m_height)))) {
          tcu::RGBA::RGBA(&local_304,(Vec4 *)&posBinding);
          uVar11 = (ulong)local_304.m_value;
          *(deUint32 *)
           ((long)refImg.m_pixels.m_ptr + (long)(int)(iVar17 + refImg.m_width * uVar13) * 4) =
               local_304.m_value;
        }
      }
      uVar13 = uVar13 + 1;
      uVar15 = (ulong)((int)local_278 + 1);
    }
    coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
    _M_impl.super__Vector_impl_data._M_start = local_260 + 1;
  }
  bVar4 = tcu::fuzzyCompare(log,"Result","Image comparison result",&refImg,&testImg,0.02,
                            COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,description
            );
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::Surface::~Surface(&refImg);
  tcu::Surface::~Surface(&testImg);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&coords.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= de::min(256, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(256, m_context.getRenderTarget().getHeight());
		const float				threshold	= 0.02f;

		const int				numPoints	= 8;

		vector<tcu::Vec3>		coords		(numPoints);
		float					pointSizeRange[2]	= { 0.0f, 0.0f };

		de::Random				rnd			(0x145fa);
		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, &pointSizeRange[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)");

		if (pointSizeRange[0] <= 0.0f || pointSizeRange[1] <= 0.0f || pointSizeRange[1] < pointSizeRange[0])
			throw tcu::TestError("Invalid GL_ALIASED_POINT_SIZE_RANGE");

		// Compute coordinates.
		{

			for (vector<tcu::Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
			{
				coord->x() = rnd.getFloat(-0.9f, 0.9f);
				coord->y() = rnd.getFloat(-0.9f, 0.9f);
				coord->z() = rnd.getFloat(pointSizeRange[0], pointSizeRange[1]);
			}
		}

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec3 a_positionSize;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n"
			"	gl_PointSize = a_positionSize.z;\n"
			"}\n",

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_positionSize", 3, (int)coords.size(), 0, (const float*)&coords[0]);
			const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
			const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

			gl.viewport(viewportX, viewportY, width, height);
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Points((int)coords.size()));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		tcu::clear(refImg.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		for (vector<tcu::Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
		{
			const int	x0		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	y0		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	x1		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	y1		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	w		= x1-x0;
			const int	h		= y1-y0;

			for (int yo = 0; yo < h; yo++)
			{
				for (int xo = 0; xo < w; xo++)
				{
					const float			xf		= (float(xo)+0.5f) / float(w);
					const float			yf		= (float(h-yo-1)+0.5f) / float(h);
					const tcu::Vec4		color	(xf, yf, 0.0f, 1.0f);
					const int			dx		= x0+xo;
					const int			dy		= y0+yo;

					if (de::inBounds(dx, 0, refImg.getWidth()) && de::inBounds(dy, 0, refImg.getHeight()))
						refImg.setPixel(dx, dy, tcu::RGBA(color));
				}
			}
		}

		// Compare
		{
			bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}